

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall
GlobOpt::OptHoistInvariant
          (GlobOpt *this,Instr *instr,BasicBlock *block,Loop *loop,Value *dstVal,Value *src1Val,
          Value *src2Val,bool isNotTypeSpecConv,bool lossy,BailOutKind bailoutKind)

{
  undefined1 *puVar1;
  IRType IVar2;
  undefined2 valueType;
  JitArenaAllocator *pJVar3;
  Opnd *pOVar4;
  ValueInfo *this_00;
  code *pcVar5;
  OpndKind OVar6;
  bool bVar7;
  BailOutKind BVar8;
  undefined4 *puVar9;
  StackSym *pSVar10;
  Value *pVVar11;
  StackSym *pSVar12;
  RegOpnd *this_01;
  BasicBlock *pBVar13;
  BasicBlock *pBVar14;
  BVSparse<Memory::JitArenaAllocator> *pBVar16;
  Instr *pIVar17;
  ValueInfo *invariantValueInfoToHoist;
  undefined7 extraout_var;
  ValueInfo *pVVar18;
  Type_conflict pBVar19;
  ValueType *this_02;
  Type_conflict pBVar20;
  GlobOptBlockData *pGVar21;
  ValueNumber VVar22;
  RegOpnd *this_03;
  BVSparse<Memory::JitArenaAllocator> *val;
  BOOLEAN BVar23;
  undefined1 local_f8 [8];
  Value *landingPadSrc1val;
  Opnd *src2;
  GlobOpt *local_e0;
  Loop **local_d8;
  BasicBlock *local_d0;
  Value *local_c8;
  Type_conflict local_c0;
  Type local_b0;
  Opnd *local_90;
  Opnd *src1;
  StackSym *local_80;
  BasicBlock *local_78;
  undefined1 local_70 [8];
  BasicBlock *block_local;
  Loop *local_60;
  Loop *loop_local;
  undefined8 local_50;
  BVSparse<Memory::JitArenaAllocator> *local_48;
  GlobOpt *local_40;
  Instr *local_38;
  Instr *instr_local;
  ulong uVar15;
  
  local_78 = loop->landingPad;
  local_90 = instr->m_src1;
  local_70 = (undefined1  [8])block;
  local_60 = loop;
  local_40 = this;
  local_38 = instr;
  if (local_90 != (Opnd *)0x0) {
    OptHoistUpdateValueType(this,loop,instr,&local_90,src1Val);
    OVar6 = IR::Opnd::GetKind(local_90);
    pOVar4 = local_90;
    if (OVar6 == OpndKindReg) {
      OVar6 = IR::Opnd::GetKind(local_90);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar7) goto LAB_0046bc79;
        *puVar9 = 0;
      }
      *(byte *)&pOVar4[1].m_valueType.field_0 = *(byte *)&pOVar4[1].m_valueType.field_0 & 0xfe;
    }
    landingPadSrc1val = (Value *)local_38->m_src2;
    if ((Opnd *)landingPadSrc1val != (Opnd *)0x0) {
      OptHoistUpdateValueType(local_40,local_60,local_38,(Opnd **)&landingPadSrc1val,src2Val);
      OVar6 = IR::Opnd::GetKind((Opnd *)landingPadSrc1val);
      pVVar11 = landingPadSrc1val;
      if (OVar6 == OpndKindReg) {
        OVar6 = IR::Opnd::GetKind((Opnd *)landingPadSrc1val);
        if (OVar6 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar7) goto LAB_0046bc79;
          *puVar9 = 0;
        }
        *(byte *)&pVVar11[1].valueInfo = *(byte *)&pVVar11[1].valueInfo & 0xfe;
      }
    }
  }
  this_03 = (RegOpnd *)local_38->m_dst;
  local_50 = (BVSparse<Memory::JitArenaAllocator> *)src1Val;
  local_48 = (BVSparse<Memory::JitArenaAllocator> *)dstVal;
  if (this_03 == (RegOpnd *)0x0) {
    this_03 = (RegOpnd *)0x0;
  }
  else {
    OVar6 = IR::Opnd::GetKind((Opnd *)this_03);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar7) goto LAB_0046bc79;
      *puVar9 = 0;
    }
  }
  if (this_03 == (RegOpnd *)0x0) {
    this_03 = (RegOpnd *)0x0;
    val = local_48;
  }
  else {
    if (local_38->m_opcode - 0x1d3 < 10) {
      lossy = lossy || (local_40->field_0xf7 & 2) == 0;
    }
    else if (local_38->m_opcode == FromVar) {
      pSVar10 = IR::RegOpnd::TryGetStackSym(local_38->m_src1);
      if ((local_38->field_0x38 & 0x10) == 0) {
        if ((pSVar10 != (StackSym *)0x0) && (bailoutKind != BailOutInvalid)) {
          if ((pSVar10->field_0x1a & 1) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar9 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x3b26,"(!src1StackSym->IsTypeSpec())","!src1StackSym->IsTypeSpec()"
                              );
            if (!bVar7) goto LAB_0046bc79;
            *puVar9 = 0;
          }
          pGVar21 = &local_78->globOptData;
          local_f8 = (undefined1  [8])GlobOptBlockData::FindValue(pGVar21,&pSVar10->super_Sym);
          if (*(ValueNumber *)&local_50->head != ((Value *)local_f8)->valueNumber) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar9 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x3b28,
                               "(src1Val->GetValueNumber() == landingPadSrc1val->GetValueNumber())",
                               "src1Val->GetValueNumber() == landingPadSrc1val->GetValueNumber()");
            if (!bVar7) goto LAB_0046bc79;
            *puVar9 = 0;
          }
          src2 = (Opnd *)local_f8;
          pVVar18 = *(ValueInfo **)((long)local_f8 + 8);
          IVar2 = (this_03->super_Opnd).m_type;
          landingPadSrc1val = (Value *)&local_38;
          local_e0 = local_40;
          local_d8 = &stack0xffffffffffffffa0;
          local_d0 = (BasicBlock *)local_70;
          local_c8 = (Value *)&bailoutKind;
          if (IVar2 == TyFloat64) {
            bVar7 = ValueType::IsNumber(&((ValueInfo *)local_50->lastFoundIndex)->super_ValueType);
            if (bVar7) {
              bVar7 = ValueType::IsNumber(&pVVar18->super_ValueType);
LAB_0046bc00:
              if (bVar7 == false) {
LAB_0046bc04:
                OptHoistInvariant::anon_class_48_6_64df1e2e::operator()
                          ((anon_class_48_6_64df1e2e *)&landingPadSrc1val);
              }
            }
          }
          else if (IVar2 == TyInt32) {
            this_02 = &((ValueInfo *)local_50->lastFoundIndex)->super_ValueType;
            if (lossy) {
              bVar7 = ValueType::IsPrimitive(this_02);
              if ((((bVar7) ||
                   (bVar7 = GlobOptBlockData::IsTypeSpecialized
                                      ((GlobOptBlockData *)((long)local_70 + 0xd0),
                                       &pSVar10->super_Sym), bVar7)) &&
                  (bVar7 = ValueType::IsPrimitive(&pVVar18->super_ValueType), !bVar7)) &&
                 (bVar7 = GlobOptBlockData::IsTypeSpecialized(pGVar21,&pSVar10->super_Sym), !bVar7))
              {
                bailoutKind = BailOutOnNotPrimitive;
                goto LAB_0046bc04;
              }
            }
            else {
              bVar7 = ValueType::IsInt(this_02);
              if (bVar7) {
                bVar7 = ValueType::IsInt(&pVVar18->super_ValueType);
                goto LAB_0046bc00;
              }
            }
          }
        }
      }
      else {
        BVar8 = IR::Instr::GetBailOutKind(local_38);
        if ((BailOutExpectingInteger < BVar8) ||
           ((0x40004eU >> (BVar8 & BailOnDivResultNotInt) & 1) == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3b20,
                             "(instrBailoutKind == IR::BailOutIntOnly || instrBailoutKind == IR::BailOutExpectingInteger || instrBailoutKind == IR::BailOutOnNotPrimitive || instrBailoutKind == IR::BailOutNumberOnly || instrBailoutKind == IR::BailOutPrimitiveButString)"
                             ,
                             "instrBailoutKind == IR::BailOutIntOnly || instrBailoutKind == IR::BailOutExpectingInteger || instrBailoutKind == IR::BailOutOnNotPrimitive || instrBailoutKind == IR::BailOutNumberOnly || instrBailoutKind == IR::BailOutPrimitiveButString"
                            );
          if (!bVar7) goto LAB_0046bc79;
          *puVar9 = 0;
        }
      }
    }
    if (local_48 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      local_48 = (BVSparse<Memory::JitArenaAllocator> *)
                 NewGenericValue(local_40,(ValueType)0x9,&this_03->super_Opnd);
    }
    if (isNotTypeSpecConv) {
      bVar7 = false;
    }
    else {
      bVar7 = local_38->m_opcode != LdC_A_I4;
    }
    pSVar10 = this_03->m_sym;
    if ((pSVar10->field_0x1a & 1) != 0) {
      pSVar10 = StackSym::GetVarEquivSym(pSVar10,local_40->func);
    }
    pVVar11 = GlobOptBlockData::FindValue(&local_60->landingPad->globOptData,&pSVar10->super_Sym);
    if (pVVar11 == (Value *)0x0) {
      BVar23 = BVSparse<Memory::JitArenaAllocator>::Test
                         (local_60->symsDefInLoop,(pSVar10->super_Sym).m_id);
    }
    else {
      BVar23 = *(ValueNumber *)&local_48->head != pVVar11->valueNumber;
    }
    val = local_48;
    if (!(bool)(BVar23 == '\0' & bVar7)) {
      pSVar12 = this_03->m_sym;
      if ((pSVar12->field_0x1a & 1) != 0) {
        pSVar12 = StackSym::GetVarEquivSym(pSVar12,local_40->func);
      }
      val = local_48;
      if ((pSVar12->field_0x18 & 1) == 0) {
        IR::Instr::UnlinkDst(local_38);
        if ((this_03->m_sym->field_0x1a & 1) == 0) {
          this_01 = IR::RegOpnd::New((this_03->super_Opnd).m_type,local_38->m_func);
          block_local = (BasicBlock *)this_01->m_sym;
          BVSparse<Memory::JitArenaAllocator>::Set
                    (((GlobOptBlockData *)((long)local_70 + 0xd0))->liveVarSyms,
                     *(BVIndex *)&block_local->loop);
        }
        else {
          pBVar13 = (BasicBlock *)StackSym::New(TyVar,local_38->m_func);
          IVar2 = this_03->m_sym->m_type;
          if (IVar2 == TyFloat64) {
            BVSparse<Memory::JitArenaAllocator>::Set
                      (((GlobOptBlockData *)((long)local_70 + 0xd0))->liveFloat64Syms,
                       *(BVIndex *)&pBVar13->loop);
            pBVar14 = (BasicBlock *)
                      StackSym::GetFloat64EquivSym((StackSym *)pBVar13,local_38->m_func);
          }
          else {
            pBVar14 = pBVar13;
            if (IVar2 == TyInt32) {
              if (lossy == false) {
                BVSparse<Memory::JitArenaAllocator>::Set
                          (((GlobOptBlockData *)((long)local_70 + 0xd0))->liveInt32Syms,
                           *(BVIndex *)&pBVar13->loop);
              }
              pBVar14 = (BasicBlock *)
                        StackSym::GetInt32EquivSym((StackSym *)pBVar13,local_38->m_func);
            }
          }
          block_local = pBVar13;
          this_01 = IR::RegOpnd::New((StackSym *)pBVar14,pBVar14->field_0x1c,local_38->m_func);
        }
        valueType = (this_03->super_Opnd).m_valueType;
        IR::Opnd::SetValueType(&this_01->super_Opnd,(ValueType)valueType);
        pIVar17 = IR::Instr::New(Ld_A,&this_03->super_Opnd,&this_01->super_Opnd,local_38->m_func);
        IR::Instr::SetByteCodeOffset(pIVar17,local_38);
        IR::Instr::SetDst(local_38,&this_01->super_Opnd);
        IR::Instr::InsertBefore(local_38,pIVar17);
        puVar1 = &this_03->m_sym->field_0x18;
        *(uint *)puVar1 = *(uint *)puVar1 | 0x80000;
        pOVar4 = local_38->m_src1;
        if (((pOVar4 != (Opnd *)0x0) &&
            (((OVar6 = IR::Opnd::GetKind(pOVar4), OVar6 == OpndKindIntConst ||
              (OVar6 = IR::Opnd::GetKind(pOVar4), OVar6 == OpndKindInt64Const)) ||
             ((OVar6 = IR::Opnd::GetKind(pOVar4), OVar6 == OpndKindAddr ||
              (OVar6 = IR::Opnd::GetKind(pOVar4), OVar6 == OpndKindHelperCall)))))) &&
           ((local_38->m_opcode - 0x1e4 < 2 || (local_38->m_opcode == Ld_A)))) {
          StackSym::SetIsConst(this_01->m_sym);
        }
        val = local_48;
        pVVar18 = (ValueInfo *)local_48->lastFoundIndex;
        pSVar12 = (StackSym *)pVVar18->symStore;
        if (pSVar12 == (StackSym *)0x0) {
          if (lossy == false) goto LAB_0046b9f3;
        }
        else if (pSVar12 == pSVar10 && lossy == false) {
LAB_0046b9f3:
          GlobOptBlockData::SetChangedSym(&local_40->currentBlock->globOptData,(Sym *)pSVar12);
          ValueInfo::SetSymStore(pVVar18,(Sym *)block_local);
        }
        GlobOptBlockData::InsertNewValue
                  ((GlobOptBlockData *)((long)local_70 + 0xd0),(Value *)val,&this_01->super_Opnd);
        this_03 = this_01;
      }
    }
  }
  BasicBlock::UnlinkInstr((BasicBlock *)local_70,local_38);
  pIVar17 = local_60->bailOutInfo->bailOutInstr;
  if (pIVar17 == (Instr *)0x0) {
    BasicBlock::InsertAfter(local_78,local_38);
  }
  else {
    IR::Instr::InsertBefore(pIVar17,local_38);
  }
  MarkNonByteCodeUsed(local_38);
  if ((local_38->field_0x38 & 0x50) != 0) {
    if (local_60->bailOutInfo == (BailOutInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3bcd,"(loop->bailOutInfo)","loop->bailOutInfo");
      if (!bVar7) goto LAB_0046bc79;
      *puVar9 = 0;
    }
    EnsureBailTarget(local_40,local_60);
    IR::Instr::ReplaceBailOutInfo(local_38,local_60->bailOutInfo);
  }
  if (this_03 == (RegOpnd *)0x0) {
    return;
  }
  pBVar13 = (BasicBlock *)this_03->m_sym;
  block_local = pBVar13;
  if ((pBVar13->field_0x1a & 1) != 0) {
    pBVar13 = (BasicBlock *)StackSym::GetVarEquivSym((StackSym *)pBVar13,(Func *)0x0);
  }
  if (pBVar13 == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3be0,"(dstVarSym)","dstVarSym");
    if (!bVar7) goto LAB_0046bc79;
    *puVar9 = 0;
  }
  if ((isNotTypeSpecConv) ||
     (bVar7 = GlobOptBlockData::IsLive(&local_60->landingPad->globOptData,(Sym *)pBVar13), !bVar7))
  {
    if (lossy != false) {
      if ((block_local->field_0x1a & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3bed,"(dstSym->IsTypeSpec())","dstSym->IsTypeSpec()");
        if (!bVar7) goto LAB_0046bc79;
        *puVar9 = 0;
      }
      if (block_local->field_0x1c == '\x03') {
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3bee,"(dstSym->IsInt32())","dstSym->IsInt32()");
      if (bVar7) {
        *puVar9 = 0;
        return;
      }
      goto LAB_0046bc79;
    }
    bVar7 = val == local_50;
    local_50 = (BVSparse<Memory::JitArenaAllocator> *)CONCAT71(local_50._1_7_,bVar7);
    if (bVar7) {
      if (local_38->m_src1 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3bf8,"(instr->GetSrc1())","instr->GetSrc1()");
        if (!bVar7) goto LAB_0046bc79;
        *puVar9 = 0;
      }
      OVar6 = IR::Opnd::GetKind(local_38->m_src1);
      if (OVar6 != OpndKindReg) goto LAB_0046b332;
      pOVar4 = local_38->m_src1;
      OVar6 = IR::Opnd::GetKind(pOVar4);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar7) goto LAB_0046bc79;
        *puVar9 = 0;
      }
      pSVar10 = (StackSym *)pOVar4[1]._vptr_Opnd;
      if (((pSVar10->field_0x1a & 1) != 0) &&
         (pSVar10 = StackSym::GetVarEquivSym(pSVar10,(Func *)0x0), pSVar10 == (StackSym *)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3bff,"(src1Sym)","src1Sym");
        if (!bVar7) goto LAB_0046bc79;
        *puVar9 = 0;
        pSVar10 = (StackSym *)0x0;
      }
      pBVar16 = (BVSparse<Memory::JitArenaAllocator> *)
                GlobOptBlockData::FindValue
                          ((GlobOptBlockData *)((long)local_70 + 0xd0),&pSVar10->super_Sym);
      local_80 = (StackSym *)0x0;
      if (val == pBVar16) {
        local_80 = pSVar10;
      }
    }
    else {
LAB_0046b332:
      local_80 = (StackSym *)0x0;
    }
    local_78 = pBVar13;
    if (local_38->m_opcode == ExtendArg_A) {
      if (local_38->m_src1 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3c0c,"(instr->GetSrc1())","instr->GetSrc1()");
        if (!bVar7) goto LAB_0046bc79;
        *puVar9 = 0;
      }
      pSVar10 = (StackSym *)((ValueInfo *)val->lastFoundIndex)->symStore;
      pSVar12 = IR::Opnd::GetStackSym(local_38->m_dst);
      if (pSVar10 != pSVar12) {
        local_80 = (StackSym *)((ValueInfo *)val->lastFoundIndex)->symStore;
        local_50 = (BVSparse<Memory::JitArenaAllocator> *)CONCAT71(local_50._1_7_,1);
        if ((local_80->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar7) {
LAB_0046bc79:
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar9 = 0;
        }
      }
    }
    src1._4_4_ = *(ValueNumber *)&val->head;
    VVar22 = 0;
    local_48 = val;
    InvariantBlockBackwardIterator::InvariantBlockBackwardIterator
              ((InvariantBlockBackwardIterator *)&landingPadSrc1val,local_40,(BasicBlock *)local_70,
               local_60->landingPad,(StackSym *)0x0,0,false);
    loop_local = (Loop *)__tls_get_addr(&PTR_0155fe48);
    src1._0_4_ = 0;
    while (local_d0 != (BasicBlock *)src2) {
      pBVar13 = InvariantBlockBackwardIterator::Block
                          ((InvariantBlockBackwardIterator *)&landingPadSrc1val);
      pGVar21 = &pBVar13->globOptData;
      bVar7 = GlobOptBlockData::IsLive(pGVar21,(Sym *)local_78);
      if (bVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        loop_local->implicitCallFlags = ImplicitCall_None;
        loop_local->loopFlags = (LoopFlags)0x0;
        *(undefined2 *)&loop_local->field_0x2 = 0;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3c1d,"(!hoistBlockData.IsLive(dstVarSym))",
                           "!hoistBlockData.IsLive(dstVarSym)");
        if (!bVar7) goto LAB_0046bc79;
        loop_local->implicitCallFlags = ImplicitCall_HasNoInfo;
        loop_local->loopFlags = (LoopFlags)0x0;
        *(undefined2 *)&loop_local->field_0x2 = 0;
      }
      GlobOptBlockData::MakeLive(pGVar21,(StackSym *)block_local,false);
      if ((char)local_50 == '\0') {
        pJVar3 = local_40->alloc;
        ValueInfo::SetIsShared((ValueInfo *)local_48->lastFoundIndex);
        pVVar18 = (ValueInfo *)local_48->lastFoundIndex;
        pVVar11 = (Value *)new<Memory::JitArenaAllocator>(0x10,pJVar3,0x3f1274);
        pVVar11->valueNumber = src1._4_4_;
LAB_0046b5dd:
        pVVar11->valueInfo = pVVar18;
      }
      else if (((local_80 == (StackSym *)0x0) ||
               (pVVar11 = GlobOptBlockData::FindValue(pGVar21,&local_80->super_Sym),
               pVVar11 == (Value *)0x0)) || (pVVar11->valueNumber != src1._4_4_)) {
        if (VVar22 == (ValueNumber)src1) {
          VVar22 = local_40->currentValue;
          local_40->currentValue = VVar22 + 1;
          if (VVar22 == 0) {
            Js::Throw::OutOfMemory();
          }
        }
        pJVar3 = local_40->alloc;
        ValueInfo::SetIsShared((ValueInfo *)local_48->lastFoundIndex);
        pVVar18 = (ValueInfo *)local_48->lastFoundIndex;
        pVVar11 = (Value *)new<Memory::JitArenaAllocator>(0x10,pJVar3,0x3f1274);
        pVVar11->valueNumber = VVar22;
        goto LAB_0046b5dd;
      }
      GlobOptBlockData::SetValue(pGVar21,pVVar11,(Sym *)local_78);
      InvariantBlockBackwardIterator::MoveNext((InvariantBlockBackwardIterator *)&landingPadSrc1val)
      ;
    }
    if (local_c0 == (Type_conflict)0x0) {
      return;
    }
    pBVar20 = local_b0->bvFreeList;
    do {
      pBVar19 = local_c0;
      local_c0 = pBVar19->next;
      pBVar19->next = pBVar20;
      pBVar20 = pBVar19;
    } while (local_c0 != (Type)0x0);
    goto LAB_0046bb92;
  }
  OVar6 = IR::Opnd::GetKind(local_38->m_src1);
  if (OVar6 == OpndKindReg) {
    pOVar4 = local_38->m_src1;
    local_78 = pBVar13;
    OVar6 = IR::Opnd::GetKind(pOVar4);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar7) goto LAB_0046bc79;
      *puVar9 = 0;
    }
    pBVar14 = (BasicBlock *)pOVar4[1]._vptr_Opnd;
    if (pBVar14 == block_local) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3c44,"(srcSym != dstSym)","srcSym != dstSym");
      if (!bVar7) goto LAB_0046bc79;
      *puVar9 = 0;
    }
    if ((pBVar14->field_0x1a & 1) != 0) {
      pBVar14 = (BasicBlock *)StackSym::GetVarEquivSym((StackSym *)pBVar14,(Func *)0x0);
    }
    pBVar13 = local_78;
    if (pBVar14 != local_78) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3c46,"(srcVarSym == dstVarSym)","srcVarSym == dstVarSym");
      if (!bVar7) goto LAB_0046bc79;
      *puVar9 = 0;
      pBVar13 = local_78;
    }
  }
  if ((block_local->field_0x1a & 1) == 0) {
LAB_0046ba44:
    local_50 = (BVSparse<Memory::JitArenaAllocator> *)((ulong)local_50._4_4_ << 0x20);
LAB_0046ba4b:
    loop_local = (Loop *)((ulong)loop_local & 0xffffffff00000000);
  }
  else {
    IVar2 = (this_03->super_Opnd).m_type;
    if (IVar2 == TyFloat64) {
      if ((local_38->field_0x38 & 0x10) == 0) goto LAB_0046ba44;
      BVar8 = IR::Instr::GetBailOutKind(local_38);
      local_50 = (BVSparse<Memory::JitArenaAllocator> *)
                 CONCAT44(local_50._4_4_,CONCAT31((int3)(BVar8 >> 8),BVar8 == BailOutNumberOnly));
      goto LAB_0046ba4b;
    }
    if ((IVar2 != TyInt32) || (lossy != false)) goto LAB_0046ba44;
    uVar15 = 0;
    local_50 = (BVSparse<Memory::JitArenaAllocator> *)CONCAT44(local_50._4_4_,1);
    if ((local_38->field_0x38 & 0x10) == 0) {
LAB_0046b0d1:
      loop_local = (Loop *)CONCAT44(loop_local._4_4_,(int)CONCAT71((int7)(uVar15 >> 8),1));
    }
    else {
      BVar8 = IR::Instr::GetBailOutKind(local_38);
      uVar15 = (ulong)BVar8;
      if (BVar8 == BailOutIntOnly) goto LAB_0046b0d1;
      BVar8 = IR::Instr::GetBailOutKind(local_38);
      uVar15 = (ulong)BVar8;
      if (BVar8 == BailOutExpectingInteger) goto LAB_0046b0d1;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3c54,
                         "(!instr->HasBailOutInfo() || instr->GetBailOutKind() == IR::BailOutIntOnly || instr->GetBailOutKind() == IR::BailOutExpectingInteger)"
                         ,
                         "!instr->HasBailOutInfo() || instr->GetBailOutKind() == IR::BailOutIntOnly || instr->GetBailOutKind() == IR::BailOutExpectingInteger"
                        );
      if (!bVar7) goto LAB_0046bc79;
      *puVar9 = 0;
      loop_local = (Loop *)CONCAT44(loop_local._4_4_,(int)CONCAT71(extraout_var,1));
    }
  }
  InvariantBlockBackwardIterator::InvariantBlockBackwardIterator
            ((InvariantBlockBackwardIterator *)&landingPadSrc1val,local_40,(BasicBlock *)local_70,
             local_60->landingPad,(StackSym *)pBVar13,*(ValueNumber *)&val->head,false);
  pVVar18 = (ValueInfo *)0x0;
  local_48 = (BVSparse<Memory::JitArenaAllocator> *)CONCAT44(local_48._4_4_,(uint)lossy);
  invariantValueInfoToHoist = (ValueInfo *)0x0;
  while (local_d0 != (BasicBlock *)src2) {
    pBVar13 = InvariantBlockBackwardIterator::Block
                        ((InvariantBlockBackwardIterator *)&landingPadSrc1val);
    GlobOptBlockData::MakeLive(&pBVar13->globOptData,(StackSym *)block_local,SUB81(local_48,0));
    if ((char)local_50 != '\0') {
      pVVar11 = InvariantBlockBackwardIterator::InvariantSymValue
                          ((InvariantBlockBackwardIterator *)&landingPadSrc1val);
      this_00 = pVVar11->valueInfo;
      if (this_00 == pVVar18) {
        if (this_00 != invariantValueInfoToHoist) {
          HoistInvariantValueInfo(local_40,invariantValueInfoToHoist,pVVar11,pBVar13);
        }
      }
      else {
        if ((char)loop_local == '\0') {
          invariantValueInfoToHoist = ValueInfo::SpecializeToFloat64(this_00,local_40->alloc);
        }
        else {
          invariantValueInfoToHoist = ValueInfo::SpecializeToInt32(this_00,local_40->alloc,false);
          pBVar13 = (BasicBlock *)0x0;
        }
        ChangeValueInfo(local_40,pBVar13,pVVar11,invariantValueInfoToHoist,false,false);
        pVVar18 = this_00;
      }
    }
    InvariantBlockBackwardIterator::MoveNext((InvariantBlockBackwardIterator *)&landingPadSrc1val);
  }
  if (local_c0 == (Type_conflict)0x0) {
    return;
  }
  pBVar20 = local_b0->bvFreeList;
  do {
    pBVar19 = local_c0;
    local_c0 = pBVar19->next;
    pBVar19->next = pBVar20;
    pBVar20 = pBVar19;
  } while (local_c0 != (Type)0x0);
LAB_0046bb92:
  local_b0->bvFreeList = pBVar19;
  return;
}

Assistant:

void
GlobOpt::OptHoistInvariant(
    IR::Instr *instr,
    BasicBlock *block,
    Loop *loop,
    Value *dstVal,
    Value *const src1Val,
    Value *const src2Val,
    bool isNotTypeSpecConv,
    bool lossy,
    IR::BailOutKind bailoutKind)
{
    BasicBlock *landingPad = loop->landingPad;

    IR::Opnd* src1 = instr->GetSrc1();
    if (src1)
    {
        // We are hoisting this instruction possibly past other uses, which might invalidate the last use info. Clear it.
        OptHoistUpdateValueType(loop, instr, &src1, src1Val);

        if (src1->IsRegOpnd())
        {
            src1->AsRegOpnd()->m_isTempLastUse = false;
        }

        IR::Opnd* src2 = instr->GetSrc2();
        if (src2)
        {
            OptHoistUpdateValueType(loop, instr, &src2, src2Val);

            if (src2->IsRegOpnd())
            {
                src2->AsRegOpnd()->m_isTempLastUse = false;
            }
        }
    }

    IR::RegOpnd *dst = instr->GetDst() ? instr->GetDst()->AsRegOpnd() : nullptr;
    if(dst)
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::CmEq_I4:
        case Js::OpCode::CmNeq_I4:
        case Js::OpCode::CmLt_I4:
        case Js::OpCode::CmLe_I4:
        case Js::OpCode::CmGt_I4:
        case Js::OpCode::CmGe_I4:
        case Js::OpCode::CmUnLt_I4:
        case Js::OpCode::CmUnLe_I4:
        case Js::OpCode::CmUnGt_I4:
        case Js::OpCode::CmUnGe_I4:
            // These operations are a special case. They generate a lossy int value, and the var sym is initialized using
            // Conv_Bool. A sym cannot be live only as a lossy int sym, the var needs to be live as well since the lossy int
            // sym cannot be used to convert to var. We don't know however, whether the Conv_Bool will be hoisted. The idea
            // currently is that the sym is only used on the path in which it is initialized inside the loop. So, don't
            // hoist any liveness info for the dst.
            if (!this->GetIsAsmJSFunc())
            {
                lossy = true;
            }
            break;

        case Js::OpCode::FromVar:
        {
            StackSym* src1StackSym = IR::RegOpnd::TryGetStackSym(instr->GetSrc1());

            if (instr->HasBailOutInfo())
            {
                IR::BailOutKind instrBailoutKind = instr->GetBailOutKind();
                Assert(instrBailoutKind == IR::BailOutIntOnly ||
                    instrBailoutKind == IR::BailOutExpectingInteger ||
                    instrBailoutKind == IR::BailOutOnNotPrimitive ||
                    instrBailoutKind == IR::BailOutNumberOnly ||
                    instrBailoutKind == IR::BailOutPrimitiveButString);
            }
            else if (src1StackSym && bailoutKind != IR::BailOutInvalid)
            {
                // We may be hoisting FromVar from a region where it didn't need a bailout (src1 had a definite value type) to a region
                // where it would. In such cases, the FromVar needs a bailout based on the value type of src1 in its new position.
                Assert(!src1StackSym->IsTypeSpec());
                Value* landingPadSrc1val = landingPad->globOptData.FindValue(src1StackSym);
                Assert(src1Val->GetValueNumber() == landingPadSrc1val->GetValueNumber());

                ValueInfo *src1ValueInfo = src1Val->GetValueInfo();
                ValueInfo *landingPadSrc1ValueInfo = landingPadSrc1val->GetValueInfo();
                IRType dstType = dst->GetType();

                const auto AddBailOutToFromVar = [&]()
                {
                    instr->GetSrc1()->SetValueType(landingPadSrc1val->GetValueInfo()->Type());
                    EnsureBailTarget(loop);
                    if (block->IsLandingPad())
                    {
                        instr = instr->ConvertToBailOutInstr(instr, bailoutKind, loop->bailOutInfo->bailOutOffset);
                    }
                    else
                    {
                        instr = instr->ConvertToBailOutInstr(instr, bailoutKind);
                    }
                };

                // A definite type in the source position and not a definite type in the destination (landing pad)
                // and no bailout on the instruction; we should put a bailout on the hoisted instruction.
                if (dstType == TyInt32)
                {
                    if (lossy)
                    {
                        if ((src1ValueInfo->IsPrimitive() || block->globOptData.IsTypeSpecialized(src1StackSym)) &&                // didn't need a lossy type spec bailout in the source block
                            (!landingPadSrc1ValueInfo->IsPrimitive() && !landingPad->globOptData.IsTypeSpecialized(src1StackSym))) // needs a lossy type spec bailout in the landing pad
                        {
                            bailoutKind = IR::BailOutOnNotPrimitive;
                            AddBailOutToFromVar();
                        }
                    }
                    else if (src1ValueInfo->IsInt() && !landingPadSrc1ValueInfo->IsInt())
                    {
                        AddBailOutToFromVar();
                    }
                }
                else if ((dstType == TyFloat64 && src1ValueInfo->IsNumber() && !landingPadSrc1ValueInfo->IsNumber()))
                {
                    AddBailOutToFromVar();
                }
            }

            break;
        }
        }

        if (dstVal == NULL)
        {
            dstVal = this->NewGenericValue(ValueType::Uninitialized, dst);
        }

        // ToVar/FromVar don't need a new dst because it has to be invariant if their src is invariant.
        bool dstDoesntNeedLoad = (!isNotTypeSpecConv && instr->m_opcode != Js::OpCode::LdC_A_I4);

        StackSym *varSym = dst->m_sym;

        if (varSym->IsTypeSpec())
        {
            varSym = varSym->GetVarEquivSym(this->func);
        }

        Value *const landingPadDstVal = loop->landingPad->globOptData.FindValue(varSym);
        if(landingPadDstVal
                ? dstVal->GetValueNumber() != landingPadDstVal->GetValueNumber()
                : loop->symsDefInLoop->Test(varSym->m_id))
        {
            // We need a temp for FromVar/ToVar if dst changes in the loop.
            dstDoesntNeedLoad = false;
        }

        if (!dstDoesntNeedLoad && this->OptDstIsInvariant(dst) == false)
        {
            // Keep dst in place, hoist instr using a new dst.
            instr->UnlinkDst();

            // Set type specialization info correctly for this new sym
            StackSym *copyVarSym;
            IR::RegOpnd *copyReg;
            if (dst->m_sym->IsTypeSpec())
            {
                copyVarSym = StackSym::New(TyVar, instr->m_func);
                StackSym *copySym = copyVarSym;
                if (dst->m_sym->IsInt32())
                {
                    if(lossy)
                    {
                        // The new sym would only be live as a lossy int since we're only hoisting the store to the int version
                        // of the sym, and cannot be converted to var. It is not legal to have a sym only live as a lossy int,
                        // so don't update liveness info for this sym.
                    }
                    else
                    {
                        block->globOptData.liveInt32Syms->Set(copyVarSym->m_id);
                    }
                    copySym = copySym->GetInt32EquivSym(instr->m_func);
                }
                else if (dst->m_sym->IsFloat64())
                {
                    block->globOptData.liveFloat64Syms->Set(copyVarSym->m_id);
                    copySym = copySym->GetFloat64EquivSym(instr->m_func);
                }
                copyReg = IR::RegOpnd::New(copySym, copySym->GetType(), instr->m_func);
            }
            else
            {
                copyReg = IR::RegOpnd::New(dst->GetType(), instr->m_func);
                copyVarSym = copyReg->m_sym;
                block->globOptData.liveVarSyms->Set(copyVarSym->m_id);
            }

            copyReg->SetValueType(dst->GetValueType());
            IR::Instr *copyInstr = IR::Instr::New(Js::OpCode::Ld_A, dst, copyReg, instr->m_func);
            copyInstr->SetByteCodeOffset(instr);
            instr->SetDst(copyReg);
            instr->InsertBefore(copyInstr);

            dst->m_sym->m_mayNotBeTempLastUse = true;

            if (instr->GetSrc1() && instr->GetSrc1()->IsImmediateOpnd())
            {
                // Propagate IsIntConst if appropriate
                switch(instr->m_opcode)
                {
                case Js::OpCode::Ld_A:
                case Js::OpCode::Ld_I4:
                case Js::OpCode::LdC_A_I4:
                    copyReg->m_sym->SetIsConst();
                    break;
                }
            }

            ValueInfo *dstValueInfo = dstVal->GetValueInfo();
            if((!dstValueInfo->GetSymStore() || dstValueInfo->GetSymStore() == varSym) && !lossy)
            {
                // The destination's value may have been transferred from one of the invariant sources, in which case we should
                // keep the sym store intact, as that sym will likely have a better lifetime than this new copy sym. For
                // instance, if we're inside a conditioned block, because we don't make the copy sym live and set its value in
                // all preceding blocks, this sym would not be live after exiting this block, causing this value to not
                // participate in copy-prop after this block.
                this->SetSymStoreDirect(dstValueInfo, copyVarSym);
            }

            block->globOptData.InsertNewValue(dstVal, copyReg);
            dst = copyReg;
        }
    }

    // Move to landing pad
    block->UnlinkInstr(instr);

    if (loop->bailOutInfo->bailOutInstr)
    {
        loop->bailOutInfo->bailOutInstr->InsertBefore(instr);
    }
    else
    {
        landingPad->InsertAfter(instr);
    }

    GlobOpt::MarkNonByteCodeUsed(instr);

    if (instr->HasBailOutInfo() || instr->HasAuxBailOut())
    {
        Assert(loop->bailOutInfo);
        EnsureBailTarget(loop);

        // Copy bailout info of loop top.
        instr->ReplaceBailOutInfo(loop->bailOutInfo);
    }

    if(!dst)
    {
        return;
    }

    // The bailout info's liveness for the dst sym is not updated in loop landing pads because bailout instructions previously
    // hoisted into the loop's landing pad may bail out before the current type of the dst sym became live (perhaps due to this
    // instruction). Since the landing pad will have a shared bailout point, the bailout info cannot assume that the current
    // type of the dst sym was live during every bailout hoisted into the landing pad.

    StackSym *const dstSym = dst->m_sym;
    StackSym *const dstVarSym = dstSym->IsTypeSpec() ? dstSym->GetVarEquivSym(nullptr) : dstSym;
    Assert(dstVarSym);
    if(isNotTypeSpecConv || !loop->landingPad->globOptData.IsLive(dstVarSym))
    {
        // A new dst is being hoisted, or the same single-def dst that would not be live before this block. So, make it live and
        // update the value info with the same value info in this block.

        if(lossy)
        {
            // This is a lossy conversion to int. The instruction was given a new dst specifically for hoisting, so this new dst
            // will not be live as a var before this block. A sym cannot be live only as a lossy int sym, the var needs to be
            // live as well since the lossy int sym cannot be used to convert to var. Since the var version of the sym is not
            // going to be initialized, don't hoist any liveness info for the dst. The sym is only going to be used on the path
            // in which it is initialized inside the loop.
            Assert(dstSym->IsTypeSpec());
            Assert(dstSym->IsInt32());
            return;
        }

        // Check if the dst value was transferred from the src. If so, the value transfer needs to be replicated.
        bool isTransfer = dstVal == src1Val;

        StackSym *transferValueOfSym = nullptr;
        if(isTransfer)
        {
            Assert(instr->GetSrc1());
            if(instr->GetSrc1()->IsRegOpnd())
            {
                StackSym *src1Sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
                if(src1Sym->IsTypeSpec())
                {
                    src1Sym = src1Sym->GetVarEquivSym(nullptr);
                    Assert(src1Sym);
                }
                if(dstVal == block->globOptData.FindValue(src1Sym))
                {
                    transferValueOfSym = src1Sym;
                }
            }
        }

        // SIMD_JS
        if (instr->m_opcode == Js::OpCode::ExtendArg_A)
        {
            // Check if we should have CSE'ed this EA
            Assert(instr->GetSrc1());

            // If the dstVal symstore is not the dst itself, then we copied the Value from another expression.
            if (dstVal->GetValueInfo()->GetSymStore() != instr->GetDst()->GetStackSym())
            {
                isTransfer = true;
                transferValueOfSym = dstVal->GetValueInfo()->GetSymStore()->AsStackSym();
            }
        }

        const ValueNumber dstValueNumber = dstVal->GetValueNumber();
        ValueNumber dstNewValueNumber = InvalidValueNumber;
        for(InvariantBlockBackwardIterator it(this, block, loop->landingPad, nullptr); it.IsValid(); it.MoveNext())
        {
            BasicBlock *const hoistBlock = it.Block();
            GlobOptBlockData &hoistBlockData = hoistBlock->globOptData;

            Assert(!hoistBlockData.IsLive(dstVarSym));
            hoistBlockData.MakeLive(dstSym, lossy);

            Value *newDstValue;
            do
            {
                if(isTransfer)
                {
                    if(transferValueOfSym)
                    {
                        newDstValue = hoistBlockData.FindValue(transferValueOfSym);
                        if(newDstValue && newDstValue->GetValueNumber() == dstValueNumber)
                        {
                            break;
                        }
                    }

                    // It's a transfer, but we don't have a sym whose value number matches in the target block. Use a new value
                    // number since we don't know if there is already a value with the current number for the target block.
                    if(dstNewValueNumber == InvalidValueNumber)
                    {
                        dstNewValueNumber = NewValueNumber();
                    }
                    newDstValue = CopyValue(dstVal, dstNewValueNumber);
                    break;
                }

                newDstValue = CopyValue(dstVal, dstValueNumber);
            } while(false);

            hoistBlockData.SetValue(newDstValue, dstVarSym);
        }
        return;
    }

#if DBG
    if(instr->GetSrc1()->IsRegOpnd()) // Type spec conversion may load a constant into a dst sym
    {
        StackSym *const srcSym = instr->GetSrc1()->AsRegOpnd()->m_sym;
        Assert(srcSym != dstSym); // Type spec conversion must be changing the type, so the syms must be different
        StackSym *const srcVarSym = srcSym->IsTypeSpec() ? srcSym->GetVarEquivSym(nullptr) : srcSym;
        Assert(srcVarSym == dstVarSym); // Type spec conversion must be between variants of the same var sym
    }
#endif

    bool changeValueType = false, changeValueTypeToInt = false;
    if(dstSym->IsTypeSpec())
    {
        if(dst->IsInt32())
        {
            if(!lossy)
            {
                Assert(
                    !instr->HasBailOutInfo() ||
                    instr->GetBailOutKind() == IR::BailOutIntOnly ||
                    instr->GetBailOutKind() == IR::BailOutExpectingInteger);
                changeValueType = changeValueTypeToInt = true;
            }
        }
        else if (dst->IsFloat64())
        {
            if(instr->HasBailOutInfo() && instr->GetBailOutKind() == IR::BailOutNumberOnly)
            {
                changeValueType = true;
            }
        }
    }

    ValueInfo *previousValueInfoBeforeUpdate = nullptr, *previousValueInfoAfterUpdate = nullptr;
    for(InvariantBlockBackwardIterator it(
            this,
            block,
            loop->landingPad,
            dstVarSym,
            dstVal->GetValueNumber());
        it.IsValid();
        it.MoveNext())
    {
        BasicBlock *const hoistBlock = it.Block();
        GlobOptBlockData &hoistBlockData = hoistBlock->globOptData;

    #if DBG
        // TODO: There are some odd cases with field hoisting where the sym is invariant in only part of the loop and the info
        // does not flow through all blocks. Un-comment the verification below after PRE replaces field hoisting.

        //// Verify that the src sym is live as the required type, and that the conversion is valid
        //Assert(IsLive(dstVarSym, &hoistBlockData));
        //if(instr->GetSrc1()->IsRegOpnd())
        //{
        //    IR::RegOpnd *const src = instr->GetSrc1()->AsRegOpnd();
        //    StackSym *const srcSym = instr->GetSrc1()->AsRegOpnd()->m_sym;
        //    if(srcSym->IsTypeSpec())
        //    {
        //        if(src->IsInt32())
        //        {
        //            Assert(hoistBlockData.liveInt32Syms->Test(dstVarSym->m_id));
        //            Assert(!hoistBlockData.liveLossyInt32Syms->Test(dstVarSym->m_id)); // shouldn't try to convert a lossy int32 to anything
        //        }
        //        else
        //        {
        //            Assert(src->IsFloat64());
        //            Assert(hoistBlockData.liveFloat64Syms->Test(dstVarSym->m_id));
        //            if(dstSym->IsTypeSpec() && dst->IsInt32())
        //            {
        //                Assert(lossy); // shouldn't try to do a lossless conversion from float64 to int32
        //            }
        //        }
        //    }
        //    else
        //    {
        //        Assert(hoistBlockData.liveVarSyms->Test(dstVarSym->m_id));
        //    }
        //}
        //if(dstSym->IsTypeSpec() && dst->IsInt32())
        //{
        //    // If the sym is already specialized as required in the block to which we are attempting to hoist the conversion,
        //    // that info should have flowed into this block
        //    if(lossy)
        //    {
        //        Assert(!hoistBlockData.liveInt32Syms->Test(dstVarSym->m_id));
        //    }
        //    else
        //    {
        //        Assert(!IsInt32TypeSpecialized(dstVarSym, hoistBlock));
        //    }
        //}
    #endif

        hoistBlockData.MakeLive(dstSym, lossy);

        if(!changeValueType)
        {
            continue;
        }

        Value *const hoistBlockValue = it.InvariantSymValue();
        ValueInfo *const hoistBlockValueInfo = hoistBlockValue->GetValueInfo();
        if(hoistBlockValueInfo == previousValueInfoBeforeUpdate)
        {
            if(hoistBlockValueInfo != previousValueInfoAfterUpdate)
            {
                HoistInvariantValueInfo(previousValueInfoAfterUpdate, hoistBlockValue, hoistBlock);
            }
        }
        else
        {
            previousValueInfoBeforeUpdate = hoistBlockValueInfo;
            ValueInfo *const newValueInfo =
                changeValueTypeToInt
                    ? hoistBlockValueInfo->SpecializeToInt32(alloc)
                    : hoistBlockValueInfo->SpecializeToFloat64(alloc);
            previousValueInfoAfterUpdate = newValueInfo;
            ChangeValueInfo(changeValueTypeToInt ? nullptr : hoistBlock, hoistBlockValue, newValueInfo);
        }
    }
}